

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O0

size_t bssl::tls_seal_scatter_prefix_len(SSL *ssl,uint8_t type,size_t in_len)

{
  bool bVar1;
  SSL_CIPHER *cipher;
  pointer pSVar2;
  size_t local_28;
  size_t ret;
  size_t in_len_local;
  uint8_t type_local;
  SSL *ssl_local;
  
  if (((type == '\x17') && (1 < in_len)) && (bVar1 = ssl_needs_record_splitting(ssl), bVar1)) {
    pSVar2 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                       (&ssl->s3->aead_write_ctx);
    cipher = SSLAEADContext::cipher(pSVar2);
    local_28 = ssl_cipher_get_record_split_len(cipher);
    local_28 = local_28 + 9;
  }
  else {
    pSVar2 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                       (&ssl->s3->aead_write_ctx);
    local_28 = SSLAEADContext::ExplicitNonceLen(pSVar2);
    local_28 = local_28 + 5;
  }
  return local_28;
}

Assistant:

static size_t tls_seal_scatter_prefix_len(const SSL *ssl, uint8_t type,
                                          size_t in_len) {
  size_t ret = SSL3_RT_HEADER_LENGTH;
  if (type == SSL3_RT_APPLICATION_DATA && in_len > 1 &&
      ssl_needs_record_splitting(ssl)) {
    // In the case of record splitting, the 1-byte record (of the 1/n-1 split)
    // will be placed in the prefix, as will four of the five bytes of the
    // record header for the main record. The final byte will replace the first
    // byte of the plaintext that was used in the small record.
    ret += ssl_cipher_get_record_split_len(ssl->s3->aead_write_ctx->cipher());
    ret += SSL3_RT_HEADER_LENGTH - 1;
  } else {
    ret += ssl->s3->aead_write_ctx->ExplicitNonceLen();
  }
  return ret;
}